

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

ActionResultHolder<BasicTestExpr<2>_> *
testing::internal::ActionResultHolder<BasicTestExpr<2>>::
PerformDefaultAction<BasicTestExpr<2>(bool)>
          (FunctionMockerBase<BasicTestExpr<2>_(bool)> *func_mocker,ArgumentTuple *args,
          string *call_description)

{
  Result RVar1;
  ActionResultHolder<BasicTestExpr<2>_> *pAVar2;
  
  pAVar2 = (ActionResultHolder<BasicTestExpr<2>_> *)operator_new(0x10);
  RVar1 = FunctionMockerBase<BasicTestExpr<2>_(bool)>::PerformDefaultAction
                    (func_mocker,args,call_description);
  (pAVar2->super_UntypedActionResultHolderBase)._vptr_UntypedActionResultHolderBase =
       (_func_int **)&PTR__UntypedActionResultHolderBase_002b79b0;
  (pAVar2->value_).id_ = RVar1.id_;
  return pAVar2;
}

Assistant:

static ActionResultHolder* PerformDefaultAction(
      const FunctionMockerBase<F>* func_mocker,
      const typename Function<F>::ArgumentTuple& args,
      const string& call_description) {
    return new ActionResultHolder(
        func_mocker->PerformDefaultAction(args, call_description));
  }